

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# value.cpp
# Opt level: O3

Value * duckdb::Value::MAP(Value *__return_storage_ptr__,LogicalType *key_type,
                          LogicalType *value_type,vector<duckdb::Value,_true> *keys,
                          vector<duckdb::Value,_true> *values)

{
  pointer pVVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *this;
  pointer pVVar2;
  pointer pVVar3;
  undefined1 *puVar4;
  element_type *peVar5;
  Value *pVVar6;
  reference pvVar7;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *p_Var8;
  vector<duckdb::Value,_true> *this_00;
  size_type __n;
  ExtraValueInfo *__tmp;
  Value *pVVar9;
  vector<duckdb::Value,_true> new_children;
  child_list_t<LogicalType> struct_types;
  LogicalType struct_type;
  Value key;
  unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
  unique_keys;
  Value *local_1c8;
  Value *pVStack_1c0;
  pointer local_1b8;
  vector<duckdb::Value,_true> local_1a8;
  vector<duckdb::Value,_true> *local_190;
  LogicalType *local_188;
  LogicalType *local_180;
  undefined8 local_178;
  undefined8 uStack_170;
  undefined8 local_168;
  char *local_160;
  LogicalType local_158 [2];
  LogicalType local_120;
  undefined1 local_108 [64];
  undefined8 local_c8;
  undefined8 uStack_c0;
  undefined8 local_b8;
  LogicalType local_b0;
  LogicalType local_98;
  LogicalType local_80;
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  local_68;
  
  local_190 = keys;
  local_188 = value_type;
  LogicalType::LogicalType(&local_80,SQLNULL);
  Value(__return_storage_ptr__,&local_80);
  LogicalType::~LogicalType(&local_80);
  LogicalType::LogicalType(&local_98,key_type);
  LogicalType::LogicalType(&local_b0,local_188);
  local_180 = key_type;
  LogicalType::MAP((LogicalType *)local_108,&local_98,&local_b0);
  (__return_storage_ptr__->type_).id_ = local_108[0];
  (__return_storage_ptr__->type_).physical_type_ = local_108[1];
  peVar5 = (element_type *)CONCAT44(local_108._12_4_,local_108._8_4_);
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)
           CONCAT44(local_108._20_4_,local_108._16_4_);
  local_108._8_4_ =
       *(undefined4 *)
        &(__return_storage_ptr__->type_).type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  local_108._12_4_ =
       *(undefined4 *)
        ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr + 4);
  local_108._16_4_ =
       *(undefined4 *)
        &(__return_storage_ptr__->type_).type_info_.internal.
         super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  local_108._20_4_ =
       *(undefined4 *)
        ((long)&(__return_storage_ptr__->type_).type_info_.internal.
                super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount.
                _M_pi + 4);
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr = peVar5;
  (__return_storage_ptr__->type_).type_info_.internal.
  super___shared_ptr<duckdb::ExtraTypeInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var8;
  LogicalType::~LogicalType((LogicalType *)local_108);
  LogicalType::~LogicalType(&local_b0);
  LogicalType::~LogicalType(&local_98);
  __return_storage_ptr__->is_null = false;
  local_68._M_buckets = &local_68._M_single_bucket;
  local_68._M_bucket_count = 1;
  local_68._M_before_begin._M_nxt = (_Hash_node_base *)0x0;
  local_68._M_element_count = 0;
  local_68._M_rehash_policy._M_max_load_factor = 1.0;
  local_68._M_rehash_policy._M_next_resize = 0;
  local_68._M_single_bucket = (__node_base_ptr)0x0;
  if ((local_190->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish !=
      (local_190->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start) {
    __n = 0;
    this_00 = local_190;
    do {
      local_178 = 0;
      uStack_170 = 0;
      local_168 = 0;
      local_1b8 = (pointer)0x0;
      local_1c8 = (Value *)0x0;
      pVStack_1c0 = (Value *)0x0;
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::reserve((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_178,2);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::reserve
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8,2);
      local_160 = "key";
      LogicalType::LogicalType(local_158,local_180);
      ::std::__cxx11::string::string((string *)local_108,local_160,(allocator *)&local_120);
      LogicalType::LogicalType((LogicalType *)(local_108 + 0x20),local_158);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&local_178,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)local_108);
      LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
      puVar4 = (undefined1 *)CONCAT62(local_108._2_6_,CONCAT11(local_108[1],local_108[0]));
      if (puVar4 != local_108 + 0x10) {
        operator_delete(puVar4);
      }
      LogicalType::~LogicalType(local_158);
      local_160 = "value";
      LogicalType::LogicalType(local_158,local_188);
      ::std::__cxx11::string::string((string *)local_108,local_160,(allocator *)&local_120);
      LogicalType::LogicalType((LogicalType *)(local_108 + 0x20),local_158);
      ::std::
      vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
      ::emplace_back<std::pair<std::__cxx11::string,duckdb::LogicalType>>
                ((vector<std::pair<std::__cxx11::string,duckdb::LogicalType>,std::allocator<std::pair<std::__cxx11::string,duckdb::LogicalType>>>
                  *)&local_178,
                 (pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>
                  *)local_108);
      LogicalType::~LogicalType((LogicalType *)(local_108 + 0x20));
      puVar4 = (undefined1 *)CONCAT62(local_108._2_6_,CONCAT11(local_108[1],local_108[0]));
      if (puVar4 != local_108 + 0x10) {
        operator_delete(puVar4);
      }
      LogicalType::~LogicalType(local_158);
      pvVar7 = vector<duckdb::Value,_true>::operator[](this_00,__n);
      DefaultCastAs((Value *)local_108,pvVar7,local_180,false);
      MapKeyCheck((unordered_set<unsigned_long,_std::hash<unsigned_long>,_std::equal_to<unsigned_long>,_std::allocator<unsigned_long>_>
                   *)&local_68,(Value *)local_108);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8,
                 (Value *)local_108);
      pvVar7 = vector<duckdb::Value,_true>::operator[](values,__n);
      ::std::vector<duckdb::Value,_std::allocator<duckdb::Value>_>::push_back
                ((vector<duckdb::Value,_std::allocator<duckdb::Value>_> *)&local_1c8,pvVar7);
      local_c8 = local_178;
      uStack_c0 = uStack_170;
      local_b8 = local_168;
      local_178 = 0;
      uStack_170 = 0;
      local_168 = 0;
      LogicalType::STRUCT(&local_120,(child_list_t<LogicalType> *)&local_c8);
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_c8);
      local_1a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_start = local_1c8;
      local_1a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_finish = pVStack_1c0;
      local_1a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
      super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
      super__Vector_impl_data._M_end_of_storage = local_1b8;
      local_1c8 = (Value *)0x0;
      pVStack_1c0 = (Value *)0x0;
      local_1b8 = (pointer)0x0;
      STRUCT((Value *)&local_160,&local_120,&local_1a8);
      pvVar7 = vector<duckdb::Value,_true>::operator[](values,__n);
      operator=(pvVar7,(Value *)&local_160);
      ~Value((Value *)&local_160);
      pVVar1 = local_1a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
               super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
               super__Vector_impl_data._M_finish;
      for (pVVar9 = local_1a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                    super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                    super__Vector_impl_data._M_start; pVVar9 != pVVar1; pVVar9 = pVVar9 + 1) {
        ~Value(pVVar9);
      }
      if (local_1a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
          super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
          super__Vector_impl_data._M_start != (Value *)0x0) {
        operator_delete(local_1a8.super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>.
                        super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
                        super__Vector_impl_data._M_start);
      }
      LogicalType::~LogicalType(&local_120);
      ~Value((Value *)local_108);
      pVVar6 = pVStack_1c0;
      this_00 = local_190;
      for (pVVar9 = local_1c8; local_190 = this_00, pVVar9 != pVVar6; pVVar9 = pVVar9 + 1) {
        ~Value(pVVar9);
        this_00 = local_190;
      }
      if (local_1c8 != (Value *)0x0) {
        operator_delete(local_1c8);
      }
      ::std::
      vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
      ::~vector((vector<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>,_std::allocator<std::pair<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_duckdb::LogicalType>_>_>
                 *)&local_178);
      __n = __n + 1;
    } while (__n < (ulong)((long)(this_00->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_finish -
                           (long)(this_00->
                                 super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
                                 super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>.
                                 _M_impl.super__Vector_impl_data._M_start >> 6));
  }
  p_Var8 = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)operator_new(0x38);
  p_Var8->_M_use_count = 1;
  p_Var8->_M_weak_count = 1;
  p_Var8->_vptr__Sp_counted_base = (_func_int **)&PTR___Sp_counted_ptr_inplace_024373f8;
  pVVar1 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_end_of_storage;
  pVVar2 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_start;
  pVVar3 = (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
           super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.
           super__Vector_impl_data._M_finish;
  (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_start = (pointer)0x0;
  (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_finish = (pointer)0x0;
  (values->super_vector<duckdb::Value,_std::allocator<duckdb::Value>_>).
  super__Vector_base<duckdb::Value,_std::allocator<duckdb::Value>_>._M_impl.super__Vector_impl_data.
  _M_end_of_storage = (pointer)0x0;
  *(undefined1 *)&p_Var8[1]._M_use_count = 2;
  p_Var8[1]._vptr__Sp_counted_base = (_func_int **)&PTR__NestedValueInfo_02437448;
  p_Var8[2]._vptr__Sp_counted_base = (_func_int **)pVVar2;
  *(pointer *)&p_Var8[2]._M_use_count = pVVar3;
  p_Var8[3]._vptr__Sp_counted_base = (_func_int **)pVVar1;
  if (__libc_single_threaded == '\0') {
    LOCK();
    p_Var8->_M_use_count = p_Var8->_M_use_count + 1;
    UNLOCK();
  }
  else {
    p_Var8->_M_use_count = 2;
  }
  ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(p_Var8);
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
       (element_type *)(p_Var8 + 1);
  this = (__return_storage_ptr__->value_info_).internal.
         super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi;
  (__return_storage_ptr__->value_info_).internal.
  super___shared_ptr<duckdb::ExtraValueInfo,_(__gnu_cxx::_Lock_policy)2>._M_refcount._M_pi = p_Var8;
  if (this != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    ::std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(this);
  }
  ::std::
  _Hashtable<unsigned_long,_unsigned_long,_std::allocator<unsigned_long>,_std::__detail::_Identity,_std::equal_to<unsigned_long>,_std::hash<unsigned_long>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<false,_true,_true>_>
  ::~_Hashtable(&local_68);
  return __return_storage_ptr__;
}

Assistant:

Value Value::MAP(const LogicalType &key_type, const LogicalType &value_type, vector<Value> keys, vector<Value> values) {
	D_ASSERT(keys.size() == values.size());
	Value result;

	result.type_ = LogicalType::MAP(key_type, value_type);
	result.is_null = false;
	unordered_set<hash_t> unique_keys;

	for (idx_t i = 0; i < keys.size(); i++) {
		child_list_t<LogicalType> struct_types;
		vector<Value> new_children;
		struct_types.reserve(2);
		new_children.reserve(2);

		struct_types.push_back(make_pair("key", key_type));
		struct_types.push_back(make_pair("value", value_type));

		auto key = keys[i].DefaultCastAs(key_type);
		MapKeyCheck(unique_keys, key);

		new_children.push_back(key);
		new_children.push_back(values[i]);
		auto struct_type = LogicalType::STRUCT(std::move(struct_types));
		values[i] = Value::STRUCT(struct_type, std::move(new_children));
	}

	result.value_info_ = make_shared_ptr<NestedValueInfo>(std::move(values));
	return result;
}